

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

wchar_t find_path(player *p,loc start,loc dest,int16_t **step_dirs)

{
  bool bVar1;
  loc qp;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  loc_conflict grid;
  size_t sVar8;
  size_t sVar9;
  wchar_t local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_ac;
  _Bool local_a5;
  wchar_t local_a0;
  wchar_t length;
  wchar_t penalty;
  wchar_t dist_remaining;
  wchar_t dist_stored;
  loc this_grid;
  wchar_t i;
  wchar_t dist_this;
  wchar_t add_priority;
  wchar_t add_grid;
  _Bool hit_trap;
  _Bool forbid_traps;
  _Bool only_known;
  wchar_t rubble_penalty;
  wchar_t locked_penalty;
  wchar_t unlocked_penalty;
  wchar_t dist_next;
  loc next;
  priority_queue *pending;
  pfdistances_patched distances;
  int16_t **step_dirs_local;
  player *p_local;
  int iStack_18;
  loc dest_local;
  loc start_local;
  
  distances._32_8_ = step_dirs;
  if (((p->cave == (chunk_conflict1 *)0x0) ||
      (_Var2 = square_in_bounds((chunk *)p->cave,(loc_conflict)start), !_Var2)) ||
     (_Var2 = square_in_bounds((chunk *)p->cave,(loc_conflict)dest), !_Var2)) {
    if (distances._32_8_ != 0) {
      *(undefined8 *)distances._32_8_ = 0;
    }
    return L'\xffffffff';
  }
  _Var2 = loc_eq(start,dest);
  if (_Var2) {
    if (distances._32_8_ != 0) {
      *(undefined8 *)distances._32_8_ = 0;
    }
    return L'\0';
  }
  _Var2 = square_isknown((chunk *)p->cave,(loc_conflict)start);
  local_a5 = false;
  if (_Var2) {
    local_a5 = square_isknown((chunk *)p->cave,(loc_conflict)dest);
  }
  add_priority._3_1_ = local_a5;
  _Var2 = is_valid_pf(p,dest,local_a5,true);
  if (_Var2) {
    add_priority._2_1_ = true;
  }
  else {
    _Var2 = is_valid_pf(p,dest,local_a5,false);
    if (!_Var2) {
      if (distances._32_8_ != 0) {
        *(undefined8 *)distances._32_8_ = 0;
      }
      return L'\xffffffff';
    }
    add_priority._2_1_ = false;
  }
  bVar1 = false;
  wVar3 = compute_unlocked_penalty(p);
  wVar4 = compute_locked_penalty(p);
  wVar5 = compute_rubble_penalty(p);
  initialize_patched_distances((pfdistances_patched *)&pending,p->cave->height,p->cave->width);
  dest_local.y = start.y;
  iStack_18 = dest.y;
  if (dest_local.y - iStack_18 < 0) {
    local_ac = -(dest_local.y - iStack_18);
  }
  else {
    local_ac = dest_local.y - iStack_18;
  }
  dest_local.x = start.x;
  p_local._4_4_ = dest.x;
  if (dest_local.x - p_local._4_4_ < 0) {
    local_b4 = -(dest_local.x - p_local._4_4_);
  }
  else {
    local_b4 = dest_local.x - p_local._4_4_;
  }
  if (local_ac < local_b4) {
    if (dest_local.x - p_local._4_4_ < 0) {
      local_b8 = -(dest_local.x - p_local._4_4_);
    }
    else {
      local_b8 = dest_local.x - p_local._4_4_;
    }
    local_bc = local_b8;
  }
  else {
    if (dest_local.y - iStack_18 < 0) {
      local_c0 = -(dest_local.y - iStack_18);
    }
    else {
      local_c0 = dest_local.y - iStack_18;
    }
    local_bc = local_c0;
  }
  next = (loc)qp_new((long)((local_bc + 2) * 4));
  initialize_patch((pfdistances_patched *)&pending,start,p,local_a5,add_priority._2_1_);
  set_patched_distance((pfdistances_patched *)&pending,start,L'\0');
  locked_penalty = L'\0';
  _unlocked_penalty = start;
LAB_001e88ad:
  do {
    dist_this = L'\xffffffff';
    i = L'\xffffffff';
    wVar6 = locked_penalty + L'\x10';
    for (this_grid.x = 0; this_grid.x < 8; this_grid.x = this_grid.x + 1) {
      grid = (loc_conflict)loc_sum(_unlocked_penalty,ddgrid_ddd[this_grid.x]);
      _Var2 = loc_eq((loc)grid,dest);
      if (_Var2) {
        wVar3 = patched_distances_to_path
                          ((pfdistances_patched *)&pending,start,dest,(int16_t **)distances._32_8_);
        release_patched_distances((pfdistances_patched *)&pending);
        qp_free((priority_queue *)next,(_func_void_void_ptr *)0x0);
        return wVar3;
      }
      _Var2 = has_patched_distance((pfdistances_patched *)&pending,(loc)grid);
      if (!_Var2) {
        initialize_patch((pfdistances_patched *)&pending,(loc)grid,p,add_priority._3_1_,
                         add_priority._2_1_);
      }
      wVar7 = get_patched_distance((pfdistances_patched *)&pending,(loc)grid);
      if (wVar6 < wVar7) {
        dist_remaining = grid.x;
        if (p_local._4_4_ - dist_remaining < 0) {
          local_c4 = -(p_local._4_4_ - dist_remaining);
        }
        else {
          local_c4 = p_local._4_4_ - dist_remaining;
        }
        dist_stored = grid.y;
        if (iStack_18 - dist_stored < 0) {
          local_cc = -(iStack_18 - dist_stored);
        }
        else {
          local_cc = iStack_18 - dist_stored;
        }
        if (local_c4 < local_cc) {
          if (iStack_18 - dist_stored < 0) {
            local_d0 = -(iStack_18 - dist_stored);
          }
          else {
            local_d0 = iStack_18 - dist_stored;
          }
          local_d4 = local_d0;
        }
        else {
          if (p_local._4_4_ - dist_remaining < 0) {
            local_d8 = -(p_local._4_4_ - dist_remaining);
          }
          else {
            local_d8 = p_local._4_4_ - dist_remaining;
          }
          local_d4 = local_d8;
        }
        if ((local_d4 < 0x8000000) && (wVar6 < local_d4 * -0x10 + L'\x7fffffff')) {
          _Var2 = square_isknown((chunk *)p->cave,grid);
          if ((!_Var2) || (_Var2 = square_ispassable((chunk *)p->cave,grid), _Var2)) {
            local_a0 = L'\0';
          }
          else {
            _Var2 = square_iscloseddoor((chunk *)p->cave,grid);
            if (_Var2) {
              _Var2 = square_islockeddoor((chunk *)p->cave,grid);
              local_dc = wVar4;
              if (!_Var2) {
                local_dc = wVar3;
              }
              local_a0 = local_dc;
            }
            else {
              _Var2 = square_isrubble((chunk *)p->cave,grid);
              local_a0 = wVar5;
              if (!_Var2) {
                local_a0 = L'\x7fffffff';
              }
            }
            if ((wVar7 - local_a0 <= wVar6) || ((0x7fffffff - local_a0) + local_d4 * -0x10 <= wVar6)
               ) goto LAB_001e8d7d;
          }
          if (L'\0' < dist_this) {
            sVar8 = qp_len((priority_queue *)next);
            sVar9 = qp_size((priority_queue *)next);
            if (sVar8 == sVar9) {
              sVar8 = qp_size((priority_queue *)next);
              if (sVar8 == 0) {
                __assert_fail("qp_size(pending) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                              ,0x4e1,
                              "int find_path(struct player *, struct loc, struct loc, int16_t **)");
              }
              sVar8 = qp_size((priority_queue *)next);
              qp = next;
              if (0x7fffffffffffffff < sVar8) {
LAB_001e8cf0:
                release_patched_distances((pfdistances_patched *)&pending);
                qp_free((priority_queue *)next,(_func_void_void_ptr *)0x0);
                if (distances._32_8_ != 0) {
                  *(undefined8 *)distances._32_8_ = 0;
                }
                return L'\xffffffff';
              }
              sVar8 = qp_size((priority_queue *)next);
              _Var2 = qp_resize((priority_queue *)qp,sVar8 << 1,(_func_void_void_ptr *)0x0);
              if (_Var2) goto LAB_001e8cf0;
            }
            qp_push_int((priority_queue *)next,i,dist_this);
          }
          dist_this = grid_to_i((loc)grid,p->cave->width);
          i = wVar6 + local_a0 + local_d4 * 0x10;
          set_patched_distance((pfdistances_patched *)&pending,(loc)grid,wVar6 + local_a0);
        }
      }
      else if (((add_priority._2_1_ != false) &&
               (_Var2 = square_isknown((chunk *)p->cave,grid), _Var2)) &&
              (_Var2 = square_isvisibletrap((chunk *)p->cave,grid), _Var2)) {
        bVar1 = true;
      }
LAB_001e8d7d:
    }
    if (dist_this < L'\0') {
      sVar8 = qp_len((priority_queue *)next);
      if (sVar8 == 0) {
        if (((add_priority._2_1_ == false) || (_Var2 = player_is_trapsafe(p), _Var2)) || (!bVar1)) {
          if (add_priority._3_1_ == false) {
            release_patched_distances((pfdistances_patched *)&pending);
            qp_free((priority_queue *)next,(_func_void_void_ptr *)0x0);
            if (distances._32_8_ != 0) {
              *(undefined8 *)distances._32_8_ = 0;
            }
            return L'\xffffffff';
          }
          add_priority._3_1_ = false;
          add_priority._2_1_ = is_valid_pf(p,dest,false,true);
          bVar1 = false;
          clear_patched_distances((pfdistances_patched *)&pending);
          initialize_patch((pfdistances_patched *)&pending,start,p,false,add_priority._2_1_);
          set_patched_distance((pfdistances_patched *)&pending,start,L'\0');
          locked_penalty = L'\0';
          _unlocked_penalty = start;
        }
        else {
          add_priority._2_1_ = false;
          clear_patched_distances((pfdistances_patched *)&pending);
          initialize_patch((pfdistances_patched *)&pending,start,p,add_priority._3_1_,false);
          set_patched_distance((pfdistances_patched *)&pending,start,L'\0');
          locked_penalty = L'\0';
          _unlocked_penalty = start;
        }
        goto LAB_001e88ad;
      }
      wVar6 = qp_pop_int((priority_queue *)next);
      i_to_grid(wVar6,p->cave->width,(loc *)&unlocked_penalty);
    }
    else {
      wVar6 = qp_pushpop_int((priority_queue *)next,i,dist_this);
      i_to_grid(wVar6,p->cave->width,(loc *)&unlocked_penalty);
    }
    _Var2 = has_patched_distance((pfdistances_patched *)&pending,_unlocked_penalty);
    if (!_Var2) {
      __assert_fail("has_patched_distance(&distances, next)",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                    ,0x534,"int find_path(struct player *, struct loc, struct loc, int16_t **)");
    }
    locked_penalty = get_patched_distance((pfdistances_patched *)&pending,_unlocked_penalty);
  } while( true );
}

Assistant:

int find_path(struct player *p, struct loc start, struct loc dest,
		int16_t **step_dirs)
{
	/*
	 * Store the grid at the head of the path in the queue and have
	 * separate storage for a distance array.  Initialize that distance
	 * array in patches of patch_size by patch_size to limit overhead from
	 * parts of the cave that are not traversed when moving to the
	 * destination.
	 */
	struct pfdistances_patched distances;
	struct priority_queue *pending;
	struct loc next;
	int dist_next;
	int unlocked_penalty, locked_penalty, rubble_penalty;
	bool only_known, forbid_traps, hit_trap;

	if (!p->cave || !square_in_bounds(p->cave, start)
			|| !square_in_bounds(p->cave, dest)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}

	if (loc_eq(start, dest)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return 0;
	}

	/*
	 * If both the starting point and destination are remembered grids,
	 * first try paths that only traverse remembered grids.  If there are
	 * no such paths, then try ones that can include grids that are not
	 * remembered.
	 */
	only_known = square_isknown(p->cave, start)
		&& square_isknown(p->cave, dest);
	/*
	 * First try paths that do not go through grids with known visible
	 * traps.  If there are no such paths, then try paths that include
	 * known visible traps.
	 */
	if (is_valid_pf(p, dest, only_known, true)) {
		forbid_traps = true;
	} else if (is_valid_pf(p, dest, only_known, false)) {
		forbid_traps = false;
	} else {
		/*
		 * The destination is not reachable because it contains
		 * known terrain that pathfinding can not traverse.
		 */
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
	/*
	 * Remember if the pathfinding would change because of a known visible
	 * trap.
	 */
	hit_trap = false;

	/* Precompute quantities to penalize traversing some terrain. */
	unlocked_penalty = compute_unlocked_penalty(p);
	locked_penalty = compute_locked_penalty(p);
	rubble_penalty = compute_rubble_penalty(p);

	initialize_patched_distances(&distances, p->cave->height,
		p->cave->width);

	/* Set up the priority queue of feasible paths to consider. */
	pending = qp_new(4 * (2 + MAX(ABS(start.y - dest.y),
		ABS(start.x - dest.x))));

	initialize_patch(&distances, start, p, only_known, forbid_traps);
	set_patched_distance(&distances, start, 0);
	next = start;
	dist_next = 0;
	while (1) {
		int add_grid = -1, add_priority = -1;
		/* This is the base distance to any neighbor. */
		int dist_this = dist_next + PF_SCL, i;

		/* Try the neighbors. */
		for (i = 0; i < 8; ++i) {
			struct loc this_grid = loc_sum(next, ddgrid_ddd[i]);
			int dist_stored, dist_remaining, penalty;

			if (loc_eq(this_grid, dest)) {
				/* Reached the destination. */
				int length = patched_distances_to_path(
					&distances, start, dest,
					step_dirs);

				release_patched_distances(&distances);
				qp_free(pending, NULL);
				return length;
			}

			if (!has_patched_distance(&distances, this_grid)) {
				initialize_patch(&distances, this_grid,
					p, only_known, forbid_traps);
			}
			dist_stored = get_patched_distance(&distances,
				this_grid);
			if (dist_stored <= dist_this) {
				/*
				 * Since it is unreachable or already has been
				 * visited by a path that is not longer than
				 * this one, do not need to consider it.  If
				 * not allowing traps and this grid is a known
				 * visible trap, remember that there is at
				 * least one trap that affects the pathfinding.
				 */
				if (forbid_traps && square_isknown(p->cave,
						this_grid)
						&& square_isvisibletrap(
						p->cave, this_grid)) {
					hit_trap = true;
				}
				continue;
			}

			/*
			 * Use A* pathfinding:  add an estimate (in this case
			 * the Chebyshev distance) to get from this_grid to
			 * the destination.
			 */
			dist_remaining = MAX(ABS(dest.x - this_grid.x),
				ABS(dest.y - this_grid.y));
			if (dist_remaining > INT_MAX / PF_SCL
					|| dist_this >= INT_MAX
					- PF_SCL * dist_remaining) {
				/*
				 * Can not reach the destination from this_grid
				 * in a reasonable number of turns, so skip
				 * it.
				 */
				continue;
			}
			dist_remaining *= PF_SCL;

			if (square_isknown(p->cave, this_grid)
					&& !square_ispassable(p->cave,
					this_grid)) {
				/*
				 * Penalize the distance for some known but
				 * impassable terrain.
				 */
				if (square_iscloseddoor(p->cave, this_grid)) {
					penalty = (square_islockeddoor(p->cave,
						this_grid)) ? locked_penalty :
						unlocked_penalty;
				} else if (square_isrubble(p->cave,
						this_grid)) {
					penalty = rubble_penalty;
				} else {
					/*
					 * Should not happen, treat it as
					 * completely impassable.
					 */
					penalty = INT_MAX;
				}

				if (dist_this >= dist_stored - penalty
						|| dist_this >= INT_MAX -
						penalty - dist_remaining) {
					/*
					 * The penalty makes this path
					 * no shorter than what has already
					 * reached this grid or puts the
					 * destination out of reach.  Skip it.
					 */
					continue;
				}
			} else {
				penalty = 0;
			}

			/* Push what is pending onto the queue. */
			if (add_grid > 0) {
				if (qp_len(pending) == qp_size(pending)) {
					assert(qp_size(pending) > 0);
					if (qp_size(pending) > SIZE_MAX / 2 ||
							qp_resize(pending, 2
							* qp_size(pending),
							NULL)) {
						/*
						 * Could not resize so give
						 * up.
						 */
						release_patched_distances(
							&distances);
						qp_free(pending, NULL);
						if (step_dirs) {
							*step_dirs = NULL;
						}
						return -1;
					}
				}
				qp_push_int(pending, add_priority, add_grid);
			}
			add_grid = grid_to_i(this_grid, p->cave->width);
			add_priority = dist_this + penalty + dist_remaining;
			set_patched_distance(&distances, this_grid,
				dist_this + penalty);
		}

		if (add_grid >= 0) {
			i_to_grid(qp_pushpop_int(pending, add_priority,
				add_grid), p->cave->width, &next);
		} else {
			if (qp_len(pending) == 0) {
				/*
				 * Exhausted possible paths without reaching
				 * the destination.
				 */
				if (forbid_traps && !player_is_trapsafe(p)
						&& hit_trap) {
					/*
					 * Retry but allow grids that contain
					 * known visible traps.
					 */
					forbid_traps = false;
					clear_patched_distances(&distances);
					initialize_patch(&distances, start,
						p, only_known, forbid_traps);
					set_patched_distance(&distances,
						start, 0);
					next = start;
					dist_next = 0;
					continue;
				}
				if (only_known) {
					/*
					 * Retry but allow grids that are not
					 * in the player's memory.
					 */
					only_known = false;
					if (is_valid_pf(p, dest, false, true)) {
						forbid_traps = true;
					} else {
						forbid_traps = false;
					}
					hit_trap = false;
					clear_patched_distances(&distances);
					initialize_patch(&distances, start,
						p, only_known, forbid_traps);
					set_patched_distance(&distances,
						start, 0);
					next = start;
					dist_next = 0;
					continue;
				}
				/* Nothing to retry so give up. */
				release_patched_distances(&distances);
				qp_free(pending, NULL);
				if (step_dirs) {
					*step_dirs = NULL;
				}
				return -1;
			}
			i_to_grid(qp_pop_int(pending), p->cave->width, &next);
		}
		/* The relevant patch should already have been initialized. */
		assert(has_patched_distance(&distances, next));
		dist_next = get_patched_distance(&distances, next);
	}
}